

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O0

void __thiscall Population::setInput(Population *this,int neuronIndex,Event *e)

{
  size_type sVar1;
  ostream *this_00;
  undefined8 *puVar2;
  reference ppNVar3;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  
  if (-1 < in_ESI) {
    sVar1 = std::vector<Neuron_*,_std::allocator<Neuron_*>_>::size
                      ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)(in_RDI + 0x30));
    if ((ulong)(long)in_ESI < sVar1) {
      ppNVar3 = std::vector<Neuron_*,_std::allocator<Neuron_*>_>::operator[]
                          ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)(in_RDI + 0x30),
                           (long)in_ESI);
      (*(*ppNVar3)->_vptr_Neuron[1])(*ppNVar3,in_RDX);
      return;
    }
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Index of input neuron out of range!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Index of input neuron out of range!";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual void setInput(int neuronIndex, Event* e) {
        if(neuronIndex < 0 || neuronIndex >= neurons.size()) {
            std::cout << "Index of input neuron out of range!" << std::endl;
            throw "Index of input neuron out of range!";
        }
        neurons[neuronIndex]->handleEvent(e);

    }